

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

double * __thiscall ON_MorphControl::Knot(ON_MorphControl *this,int dir)

{
  int iVar1;
  double *local_48;
  double *local_40;
  double *local_38;
  double *local_20;
  double *knot;
  int dir_local;
  ON_MorphControl *this_local;
  
  local_20 = (double *)0x0;
  iVar1 = this->m_varient;
  if (iVar1 == 1) {
    if (dir == 0) {
      local_38 = (this->m_nurbs_curve).m_knot;
    }
    else {
      local_38 = (double *)0x0;
    }
    local_20 = local_38;
  }
  else if (iVar1 == 2) {
    if ((dir == 0) || (dir == 1)) {
      local_40 = (this->m_nurbs_surface).m_knot[dir];
    }
    else {
      local_40 = (double *)0x0;
    }
    local_20 = local_40;
  }
  else if (iVar1 == 3) {
    if ((dir < 0) || (2 < dir)) {
      local_48 = (double *)0x0;
    }
    else {
      local_48 = (this->m_nurbs_cage).m_knot[dir];
    }
    local_20 = local_48;
  }
  return local_20;
}

Assistant:

const double* ON_MorphControl::Knot(int dir) const
{
  const double* knot = 0;

  switch(m_varient)
  {
  case 1:
    knot = (0 == dir) ? m_nurbs_curve.m_knot : 0;
    break;
  case 2:
    knot = (0 == dir || 1 == dir) ? m_nurbs_surface.m_knot[dir] : 0;
    break;
  case 3:
    knot = (0 <= dir && dir <= 2) ? m_nurbs_cage.m_knot[dir] : 0;
    break;
  }

  return knot;
}